

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::Equation_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
::eval_internal(Equation_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                *this,Dispatch_State *t_ss)

{
  uint uVar1;
  Type_Conversions *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  bool bVar3;
  int iVar4;
  eval_error *peVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value *this_02;
  long lVar6;
  Boxed_Value BVar7;
  string_view t_name;
  string_view t_name_00;
  undefined1 local_b8 [24];
  element_type *peStack_a0;
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  File_Position local_68;
  Boxed_Value local_58;
  Boxed_Value local_48;
  Boxed_Value local_38;
  
  chaiscript::detail::Dispatch_Engine::new_function_call
            ((Dispatch_Engine *)in_RDX->_M_allocated_capacity,
             ((reference_wrapper<chaiscript::detail::Stack_Holder> *)(in_RDX->_M_local_buf + 8))->
             _M_data,((reference_wrapper<chaiscript::Type_Conversions::Conversion_Saves> *)
                     (in_RDX->_M_local_buf + 0x18))->_M_data);
  local_b8._0_8_ = t_ss;
  local_b8._8_8_ = in_RDX;
  eval_internal::anon_class_16_2_3fe617c6::operator()
            ((array<chaiscript::Boxed_Value,_2UL> *)local_98,(anon_class_16_2_3fe617c6 *)local_b8);
  if (*(bool *)(local_98._0_8_ + 0x39) == true) {
    peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Error, cannot assign to temporary value.","");
    exception::eval_error::eval_error(peVar5,(string *)local_b8);
    __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  uVar1 = ((Type_Info *)local_98._0_8_)->m_flags;
  if ((uVar1 & 1) != 0) {
    peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Error, cannot assign to constant value.","");
    exception::eval_error::eval_error(peVar5,(string *)local_b8);
    __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  iVar4 = *(int *)&t_ss[3].m_stack_holder._M_data;
  if (iVar4 == 0x20) {
LAB_0037fc06:
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &t_ss->m_conversions,":=");
    if (iVar4 != 0) {
      local_b8._8_8_ = &local_78;
      t_name._M_str = &((t_ss->m_conversions).m_saves._M_data)->enabled;
      t_name._M_len = in_RDX->_M_allocated_capacity;
      local_b8._0_8_ = (Type_Conversions *)local_98;
      chaiscript::detail::Dispatch_Engine::call_function
                ((Dispatch_Engine *)this,t_name,
                 (atomic_uint_fast32_t *)(t_ss->m_conversions).m_conversions._M_data,
                 (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)local_b8);
      goto LAB_0037fd9a;
    }
    if ((((Type_Info *)local_98._0_8_)->m_flags & 0x20) == 0) {
      bVar3 = Type_Info::operator==((Type_Info *)local_98._0_8_,(Type_Info *)local_88._M_p);
      if (!bVar3) {
        peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
        local_b8._0_8_ = local_b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,"Mismatched types in equation","");
        exception::eval_error::eval_error(peVar5,(string *)local_b8);
        __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
    }
    this_02 = &local_48;
LAB_0037fc7f:
    Boxed_Value::assign(this_02,(Boxed_Value *)local_98);
    this_00 = (this_02->m_data).
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    *(bool *)(local_98._0_8_ + 0x39) = false;
    (this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
    super_AST_Node._vptr_AST_Node = (_func_int **)local_88._M_p;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&(this->
          super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
          super_AST_Node.identifier = paStack_80;
    if (paStack_80 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((reference_wrapper<chaiscript::detail::Stack_Holder> *)
                 (paStack_80->_M_local_buf + 8))->_M_data =
             *(int *)&((reference_wrapper<chaiscript::detail::Stack_Holder> *)
                      (paStack_80->_M_local_buf + 8))->_M_data + 1;
        UNLOCK();
      }
      else {
        *(int *)&((reference_wrapper<chaiscript::detail::Stack_Holder> *)
                 (paStack_80->_M_local_buf + 8))->_M_data =
             *(int *)&((reference_wrapper<chaiscript::detail::Stack_Holder> *)
                      (paStack_80->_M_local_buf + 8))->_M_data + 1;
      }
    }
  }
  else {
    if (((uVar1 & 0x10) != 0) &&
       (((ulong)(((shared_ptr<chaiscript::Boxed_Value::Data> *)
                 &((string *)(local_88._M_p + 0x10))->_M_dataplus)->
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr & 0x10) != 0)) {
      local_68 = (File_Position)((long)local_98 + 0x10);
      local_78._M_allocated_capacity._0_4_ = iVar4;
      local_78._8_8_ = (Type_Conversions *)local_98;
      Boxed_Number::
      visit<chaiscript::Boxed_Number::oper(chaiscript::Operators::Opers,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)::_lambda(auto:1_const&)_1_&>
                ((Boxed_Number *)this,(Boxed_Value *)local_98,(anon_class_24_3_1b4046b4 *)&local_78)
      ;
      goto LAB_0037fd9a;
    }
    if (iVar4 != 6) goto LAB_0037fc06;
    if ((uVar1 & 0x20) != 0) {
      pTVar2 = t_ss[2].m_conversions.m_conversions._M_data;
      if ((pTVar2 != (Type_Conversions *)t_ss[2].m_conversions.m_saves._M_data) &&
         ((lVar6 = (pTVar2->m_mutex)._M_impl._M_rwlock.__align, *(int *)(lVar6 + 8) == 0x22 ||
          ((*(long **)(lVar6 + 0x50) != *(long **)(lVar6 + 0x58) &&
           (*(int *)(**(long **)(lVar6 + 0x50) + 8) == 0x22)))))) {
        this_02 = &local_38;
        goto LAB_0037fc7f;
      }
      local_58.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_88._M_p;
      local_58.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paStack_80;
      local_88._M_p = (pointer)0x0;
      paStack_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
      detail::clone_if_necessary
                ((detail *)local_b8,&local_58,(atomic_uint_fast32_t *)&t_ss[3].m_conversions.m_saves
                 ,(Dispatch_State *)in_RDX);
      this_01 = paStack_80;
      paStack_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_b8._8_8_;
      local_88._M_p = (pointer)local_b8._0_8_;
      local_b8._0_8_ = (Type_Conversions *)0x0;
      local_b8._8_8_ = (Dispatch_State *)0x0;
      if (this_01 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        if ((Dispatch_State *)local_b8._8_8_ != (Dispatch_State *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.m_data.
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    local_b8._8_8_ = &local_78;
    t_name_00._M_str = &((t_ss->m_conversions).m_saves._M_data)->enabled;
    t_name_00._M_len = in_RDX->_M_allocated_capacity;
    local_b8._0_8_ = (Type_Conversions *)local_98;
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)this,t_name_00,
               (atomic_uint_fast32_t *)(t_ss->m_conversions).m_conversions._M_data,
               (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)local_b8);
  }
LAB_0037fd9a:
  lVar6 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&peStack_a0 + lVar6) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&peStack_a0 + lVar6));
    }
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != 0);
  chaiscript::detail::Dispatch_Engine::pop_function_call
            ((Dispatch_Engine *)in_RDX->_M_allocated_capacity,
             ((reference_wrapper<chaiscript::detail::Stack_Holder> *)(in_RDX->_M_local_buf + 8))->
             _M_data,((reference_wrapper<chaiscript::Type_Conversions::Conversion_Saves> *)
                     (in_RDX->_M_local_buf + 0x18))->_M_data);
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);

        auto params = [&]() {
          // The RHS *must* be evaluated before the LHS
          // consider `var range = range(x)`
          // if we declare the variable in scope first, then the name lookup fails
          // for the RHS
          auto rhs = this->children[1]->eval(t_ss);
          auto lhs = this->children[0]->eval(t_ss);
          std::array<Boxed_Value, 2> p{std::move(lhs), std::move(rhs)};
          return p;
        }();

        if (params[0].is_return_value()) {
          throw exception::eval_error("Error, cannot assign to temporary value.");
        } else if (params[0].is_const()) {
          throw exception::eval_error("Error, cannot assign to constant value.");
        }

        if (m_oper != Operators::Opers::invalid && params[0].get_type_info().is_arithmetic() && params[1].get_type_info().is_arithmetic()) {
          try {
            return Boxed_Number::do_oper(m_oper, params[0], params[1]);
          } catch (const std::exception &) {
            throw exception::eval_error("Error with unsupported arithmetic assignment operation.");
          }
        } else if (m_oper == Operators::Opers::assign) {
          try {
            if (params[0].is_undef()) {
              if (!this->children.empty()
                  && ((this->children[0]->identifier == AST_Node_Type::Reference)
                      || (!this->children[0]->children.empty() && this->children[0]->children[0]->identifier == AST_Node_Type::Reference)))

              {
                /// \todo This does not handle the case of an unassigned reference variable
                ///       being assigned outside of its declaration
                params[0].assign(params[1]);
                params[0].reset_return_value();
                return params[1];
              } else {
                params[1] = detail::clone_if_necessary(std::move(params[1]), m_clone_loc, t_ss);
              }
            }

            try {
              return t_ss->call_function(this->text, m_loc, Function_Params{params}, t_ss.conversions());
            } catch (const exception::dispatch_error &e) {
              throw exception::eval_error("Unable to find appropriate'" + this->text + "' operator.", e.parameters, e.functions, false, *t_ss);
            }
          } catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Missing clone or copy constructor for right hand side of equation",
                                        e.parameters,
                                        e.functions,
                                        false,
                                        *t_ss);
          }
        } else if (this->text == ":=") {
          if (params[0].is_undef() || Boxed_Value::type_match(params[0], params[1])) {
            params[0].assign(params[1]);
            params[0].reset_return_value();
          } else {
            throw exception::eval_error("Mismatched types in equation");
          }
        } else {
          try {
            return t_ss->call_function(this->text, m_loc, Function_Params{params}, t_ss.conversions());
          } catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Unable to find appropriate'" + this->text + "' operator.", e.parameters, e.functions, false, *t_ss);
          }
        }

        return params[1];
      }